

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::~ThreadContext(ThreadContext *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  CriticalSection *cs;
  Recycler *pRVar4;
  undefined4 *puVar5;
  RecyclableData *pRVar6;
  BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar7;
  BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar8;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar9;
  List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_02
  ;
  IActiveScriptProfilerHeapEnum *pIVar10;
  char16_t *local_80;
  ScriptContext *local_50;
  ScriptContext *scriptContext_1;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  ScriptContext *local_28;
  ScriptContext *scriptContext;
  AutoLeakReportSection __autoLeakReportSection0;
  AutoCriticalSection autocs;
  ThreadContext *this_local;
  
  cs = GetCriticalSection();
  AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&__autoLeakReportSection0,cs);
  JsUtil::DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>::Unlink<ThreadContext>
            (this,&globalListFirst,&globalListLast);
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&__autoLeakReportSection0);
  if (this->TTDContext != (ThreadContextTTD *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::ThreadContextTTD>
              (&Memory::HeapAllocator::Instance,this->TTDContext);
    this->TTDContext = (ThreadContextTTD *)0x0;
  }
  if (this->TTDExecutionInfo != (ExecutionInfoManager *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::ExecutionInfoManager>
              (&Memory::HeapAllocator::Instance,this->TTDExecutionInfo);
    this->TTDExecutionInfo = (ExecutionInfoManager *)0x0;
  }
  if (this->TTDLog != (EventLog *)0x0) {
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,TTD::EventLog>
              (&Memory::HeapAllocator::Instance,this->TTDLog);
    this->TTDLog = (EventLog *)0x0;
  }
  bVar2 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,LeakReportFlag);
  if (bVar2) {
    pRVar4 = GetRecycler(this);
    bVar2 = Memory::Recycler::IsInDllCanUnloadNow(pRVar4);
    if (bVar2) {
      local_80 = L"DllCanUnloadNow";
    }
    else {
      pRVar4 = GetRecycler(this);
      bVar2 = Memory::Recycler::IsInDetachProcess(pRVar4);
      local_80 = L"Destructor";
      if (bVar2) {
        local_80 = L"DetachProcess";
      }
    }
    Memory::AutoLeakReportSection::AutoLeakReportSection
              ((AutoLeakReportSection *)&scriptContext,
               (ConfigFlagsTable *)&Js::Configuration::Global,L"Thread Context (%p): %s (TID: %d)",
               this,local_80,(ulong)this->threadId);
    Memory::LeakReport::DumpUrl(this->threadId);
    Memory::AutoLeakReportSection::~AutoLeakReportSection((AutoLeakReportSection *)&scriptContext);
  }
  if (this->interruptPoller != (InterruptPoller *)0x0) {
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,InterruptPoller>
              (&Memory::HeapAllocator::Instance,this->interruptPoller);
    this->interruptPoller = (InterruptPoller *)0x0;
  }
  Memory::IdleDecommitPageAllocator::ShutdownIdleDecommit(&this->pageAllocator);
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::Close(&(this->pageAllocator).super_PageAllocator);
  if (this->recycler != (Recycler *)0x0) {
    for (local_28 = this->scriptContextList; local_28 != (ScriptContext *)0x0;
        local_28 = local_28->next) {
      bVar2 = Js::ScriptContext::IsActuallyClosed(local_28);
      if (!bVar2) {
        bVar2 = IsInScript(this);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                             ,0x1bf,"(!IsInScript())","Can we be in script here?");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        Js::ScriptContext::MarkForClose(local_28);
      }
    }
    pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    ppBVar7 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&pRVar6->sourceProfileManagersByUrl);
    if (*ppBVar7 !=
        (BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      this_00 = Memory::
                WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                ::operator->(&pRVar6->sourceProfileManagersByUrl);
      iVar3 = JsUtil::
              BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Count(this_00);
      if (iVar3 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0x1c7,
                           "(this->recyclableData->sourceProfileManagersByUrl == nullptr || this->recyclableData->sourceProfileManagersByUrl->Count() == 0)"
                           ,"There seems to have been a refcounting imbalance.");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    local_30 = (nullptr_t)0x0;
    pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    Memory::
    WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::operator=(&pRVar6->sourceProfileManagersByUrl,&local_30);
    local_38 = (nullptr_t)0x0;
    pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    Memory::WriteBarrierPtr<Js::FunctionEntryPointInfo>::operator=
              (&pRVar6->oldEntryPointInfo,&local_38);
    pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    ppBVar8 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&pRVar6->symbolRegistrationMap);
    if (*ppBVar8 !=
        (BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      this_01 = Memory::
                WriteBarrierPtr<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                ::operator->(&pRVar6->symbolRegistrationMap);
      JsUtil::
      BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Clear(this_01);
      local_40 = (nullptr_t)0x0;
      pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      Memory::
      WriteBarrierPtr<JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::operator=(&pRVar6->symbolRegistrationMap,&local_40);
    }
    pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    ppLVar9 = Memory::WriteBarrierPtr::operator_cast_to_List__
                        ((WriteBarrierPtr *)&pRVar6->returnedValueList);
    if (*ppLVar9 !=
        (List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
        )0x0) {
      pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      this_02 = Memory::
                WriteBarrierPtr<JsUtil::List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                ::operator->(&pRVar6->returnedValueList);
      JsUtil::
      List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      Clear(this_02);
      scriptContext_1 = (ScriptContext *)0x0;
      pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      Memory::
      WriteBarrierPtr<JsUtil::List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
      ::operator=(&pRVar6->returnedValueList,&scriptContext_1);
    }
    if (this->propertyMap != (PropertyMap *)0x0) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>>
                (&Memory::HeapAllocator::Instance,this->propertyMap);
      this->propertyMap = (PropertyMap *)0x0;
    }
    if (this->m_jitNumericProperties != (BVSparse<Memory::HeapAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::HeapAllocator>>
                (&Memory::HeapAllocator::Instance,this->m_jitNumericProperties);
      this->m_jitNumericProperties = (BVSparse<Memory::HeapAllocator> *)0x0;
    }
    Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::Unroot
              (&this->recyclableData,this->recycler);
    for (local_50 = this->scriptContextList; local_50 != (ScriptContext *)0x0;
        local_50 = local_50->next) {
      Js::ScriptContext::ClearSourceContextInfoMaps(local_50);
      Js::ScriptContext::ShutdownClearSourceLists(local_50);
    }
    if (this->rootTrackerScriptContext != (ScriptContext *)0x0) {
      Js::ScriptContext::Close(this->rootTrackerScriptContext,false);
    }
    if (this->debugManager != (DebugManager *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0x209,"(this->debugManager == nullptr)","this->debugManager == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::Recycler>
              (&Memory::HeapAllocator::Instance,this->recycler);
  }
  if (this->jobProcessor != (JobProcessor *)0x0) {
    if ((this->bgJit & 1U) == 0) {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::ForegroundJobProcessor>
                (&Memory::HeapAllocator::Instance,(ForegroundJobProcessor *)this->jobProcessor);
    }
    else {
      Memory::
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BackgroundJobProcessor>
                (&Memory::HeapAllocator::Instance,(BackgroundJobProcessor *)this->jobProcessor);
    }
    this->jobProcessor = (JobProcessor *)0x0;
  }
  DListBase<ThreadContext::CollectCallBack,_RealCount>::Clear<Memory::HeapAllocator>
            (&this->collectCallBackList,&Memory::HeapAllocator::Instance);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->protoInlineCacheByPropId);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->storeFieldInlineCacheByPropId);
  JsUtil::
  BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->isInstInlineCacheByFunction);
  DListBase<Js::EntryPointInfo_*,_RealCount>::Reset(&this->equivalentTypeCacheEntryPoints);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Reset
            (&this->noSpecialPropertyRegistry);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Reset
            (&this->onlyWritablePropertyRegistry);
  this->registeredInlineCacheCount = 0;
  this->unregisteredInlineCacheCount = 0;
  pIVar10 = GetHeapEnum(this);
  if (pIVar10 != (IActiveScriptProfilerHeapEnum *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x231,"(this->GetHeapEnum() == nullptr)",
                       "Heap enumeration should have been cleared/closed by the ScriptSite.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar10 = GetHeapEnum(this);
  if (pIVar10 != (IActiveScriptProfilerHeapEnum *)0x0) {
    ClearHeapEnum(this);
  }
  bVar2 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutByteCodeFlag);
  if ((bVar2) && (bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01e9e2b8), bVar2)) {
    Output::Print(L"Bail out byte code location count: %d",(ulong)this->bailOutByteCodeLocationCount
                 );
  }
  if (processNativeCodeSize < this->nativeCodeSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x23f,"(processNativeCodeSize >= nativeCodeSize)",
                       "processNativeCodeSize >= nativeCodeSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  InterlockedExchangeSubtract<unsigned_long>(&processNativeCodeSize,this->nativeCodeSize);
  if (this->dynamicProfileMutator != (DynamicProfileMutator *)0x0) {
    (**(code **)(*(long *)this->dynamicProfileMutator + 8))();
  }
  JsUtil::
  BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->entryPointToBuiltInOperationIdCache);
  UCrtC99MathApis::~UCrtC99MathApis(&this->ucrtC99MathApis);
  JsUtil::
  BaseDictionary<const_Js::DynamicType_*,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->dynamicObjectEnumeratorCacheMap);
  CriticalSection::~CriticalSection(&this->csFunctionBody);
  CriticalSection::~CriticalSection(&this->csCollectionCallBack);
  DListBase<ThreadContext::CollectCallBack,_RealCount>::~DListBase(&this->collectCallBackList);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
  ~ThreadCacheRegistry(&this->onlyWritablePropertyRegistry);
  Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::
  ~ThreadCacheRegistry(&this->noSpecialPropertyRegistry);
  JsUtil::
  BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->isInstInlineCacheByFunction);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->storeFieldInlineCacheByPropId);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary(&this->protoInlineCacheByPropId);
  DListBase<Js::EntryPointInfo_*,_RealCount>::~DListBase(&this->equivalentTypeCacheEntryPoints);
  Memory::ArenaAllocator::~ArenaAllocator(&this->equivalentTypeCacheInfoAllocator);
  Memory::ArenaAllocator::~ArenaAllocator(&this->isInstInlineCacheThreadInfoAllocator);
  Memory::ArenaAllocator::~ArenaAllocator(&this->inlineCacheThreadInfoAllocator);
  Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::~RecyclerRootPtr(&this->recyclableData);
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  ~CodePageAllocators(&this->codePageAllocators);
  Memory::CustomHeap::
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  ~CodePageAllocators(&this->thunkPageAllocators);
  Memory::ArenaAllocator::~ArenaAllocator(&this->threadAlloc);
  Js::DelayedFreeArrayBuffer::~DelayedFreeArrayBuffer(&this->delayFreeCallback);
  Memory::IdleDecommitPageAllocator::~IdleDecommitPageAllocator(&this->pageAllocator);
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::BackgroundPageQueue::~BackgroundPageQueue(&this->backgroundPageQueue);
  Memory::PreReservedVirtualAllocWrapper::~PreReservedVirtualAllocWrapper
            (&this->preReservedVirtualAllocator);
  return;
}

Assistant:

ThreadContext::~ThreadContext()
{
    {
        AutoCriticalSection autocs(ThreadContext::GetCriticalSection());
        ThreadContext::Unlink(this, &ThreadContext::globalListFirst, &ThreadContext::globalListLast);
    }

#if ENABLE_TTD
    if(this->TTDContext != nullptr)
    {
        TT_HEAP_DELETE(TTD::ThreadContextTTD, this->TTDContext);
        this->TTDContext = nullptr;
    }

    if(this->TTDExecutionInfo != nullptr)
    {
        TT_HEAP_DELETE(TTD::ThreadContextTTD, this->TTDExecutionInfo);
        this->TTDExecutionInfo = nullptr;
    }

    if(this->TTDLog != nullptr)
    {
        TT_HEAP_DELETE(TTD::EventLog, this->TTDLog);
        this->TTDLog = nullptr;
    }
#endif

#ifdef LEAK_REPORT
    if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
    {
        AUTO_LEAK_REPORT_SECTION(Js::Configuration::Global.flags, _u("Thread Context (%p): %s (TID: %d)"), this,
            this->GetRecycler()->IsInDllCanUnloadNow()? _u("DllCanUnloadNow") :
            this->GetRecycler()->IsInDetachProcess()? _u("DetachProcess") : _u("Destructor"), this->threadId);
        LeakReport::DumpUrl(this->threadId);
    }
#endif
    if (interruptPoller)
    {
        HeapDelete(interruptPoller);
        interruptPoller = nullptr;
    }

#if DBG
    // ThreadContext dtor may be running on a different thread.
    // Recycler may call finalizer that free temp Arenas, which will free pages back to
    // the page Allocator, which will try to suspend idle on a different thread.
    // So we need to disable idle decommit asserts.
    pageAllocator.ShutdownIdleDecommit();
#endif

    // Allocating memory during the shutdown codepath is not preferred
    // so we'll close the page allocator before we release the GC
    // If any dispose is allocating memory during shutdown, that is a bug
    pageAllocator.Close();

    // The recycler need to delete before the background code gen thread
    // because that might run finalizer which need access to the background code gen thread.
    if (recycler != nullptr)
    {
        for (Js::ScriptContext *scriptContext = scriptContextList; scriptContext; scriptContext = scriptContext->next)
        {
            if (!scriptContext->IsActuallyClosed())
            {
                // We close ScriptContext here because anyhow HeapDelete(recycler) when disposing the
                // JavaScriptLibrary will close ScriptContext. Explicit close gives us chance to clear
                // other things to which ScriptContext holds reference to
                AssertMsg(!IsInScript(), "Can we be in script here?");
                scriptContext->MarkForClose();
            }
        }

        // If all scriptContext's have been closed, then the sourceProfileManagersByUrl
        // should have been released
        AssertMsg(this->recyclableData->sourceProfileManagersByUrl == nullptr ||
            this->recyclableData->sourceProfileManagersByUrl->Count() == 0, "There seems to have been a refcounting imbalance.");

        this->recyclableData->sourceProfileManagersByUrl = nullptr;
        this->recyclableData->oldEntryPointInfo = nullptr;

        if (this->recyclableData->symbolRegistrationMap != nullptr)
        {
            this->recyclableData->symbolRegistrationMap->Clear();
            this->recyclableData->symbolRegistrationMap = nullptr;
        }

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->recyclableData->returnedValueList != nullptr)
        {
            this->recyclableData->returnedValueList->Clear();
            this->recyclableData->returnedValueList = nullptr;
        }
#endif

        if (this->propertyMap != nullptr)
        {
            HeapDelete(this->propertyMap);
            this->propertyMap = nullptr;
        }

#if ENABLE_NATIVE_CODEGEN
        if (this->m_jitNumericProperties != nullptr)
        {
            HeapDelete(this->m_jitNumericProperties);
            this->m_jitNumericProperties = nullptr;
        }
#endif
        // Unpin the memory for leak report so we don't report this as a leak.
        recyclableData.Unroot(recycler);

#if defined(LEAK_REPORT) || defined(CHECK_MEMORY_LEAK)
        for (Js::ScriptContext *scriptContext = scriptContextList; scriptContext; scriptContext = scriptContext->next)
        {
            scriptContext->ClearSourceContextInfoMaps();
            scriptContext->ShutdownClearSourceLists();
        }

#ifdef LEAK_REPORT
        // heuristically figure out which one is the root tracker script engine
        // and force close on it
        if (this->rootTrackerScriptContext != nullptr)
        {
            this->rootTrackerScriptContext->Close(false);
        }
#endif
#endif
#if ENABLE_NATIVE_CODEGEN
#if !FLOATVAR
        if (this->codeGenNumberThreadAllocator)
        {
            HeapDelete(this->codeGenNumberThreadAllocator);
            this->codeGenNumberThreadAllocator = nullptr;
        }
        if (this->xProcNumberPageSegmentManager)
        {
            HeapDelete(this->xProcNumberPageSegmentManager);
            this->xProcNumberPageSegmentManager = nullptr;
        }
#endif
#endif
#ifdef ENABLE_SCRIPT_DEBUGGING
        Assert(this->debugManager == nullptr);
#endif

#if ENABLE_CONCURRENT_GC && defined(_WIN32)
        AssertOrFailFastMsg(recycler->concurrentThread == NULL, "Recycler background thread should have been shutdown before destroying Recycler.");
        AssertOrFailFastMsg((recycler->parallelThread1.concurrentThread == NULL) && (recycler->parallelThread2.concurrentThread == NULL), "Recycler parallelThread(s) should have been shutdown before destroying Recycler.");
#endif

        HeapDelete(recycler);
    }

#if ENABLE_NATIVE_CODEGEN
    if(jobProcessor)
    {
        if(this->bgJit)
        {
            HeapDelete(static_cast<JsUtil::BackgroundJobProcessor *>(jobProcessor));
        }
        else
        {
            HeapDelete(static_cast<JsUtil::ForegroundJobProcessor *>(jobProcessor));
        }
        jobProcessor = nullptr;
    }
#endif

    // Do not require all GC callbacks to be revoked, because Trident may not revoke if there
    // is a leak, and we don't want the leak to be masked by an assert

    this->collectCallBackList.Clear(&HeapAllocator::Instance);
    this->protoInlineCacheByPropId.Reset();
    this->storeFieldInlineCacheByPropId.Reset();
    this->isInstInlineCacheByFunction.Reset();
    this->equivalentTypeCacheEntryPoints.Reset();
    this->noSpecialPropertyRegistry.Reset();
    this->onlyWritablePropertyRegistry.Reset();

    this->registeredInlineCacheCount = 0;
    this->unregisteredInlineCacheCount = 0;

    AssertMsg(this->GetHeapEnum() == nullptr, "Heap enumeration should have been cleared/closed by the ScriptSite.");
    if (this->GetHeapEnum() != nullptr)
    {
        this->ClearHeapEnum();
    }

#ifdef BAILOUT_INJECTION
    if (Js::Configuration::Global.flags.IsEnabled(Js::BailOutByteCodeFlag)
        && Js::Configuration::Global.flags.BailOutByteCode.Empty())
    {
        Output::Print(_u("Bail out byte code location count: %d"), this->bailOutByteCodeLocationCount);
    }
#endif

    Assert(processNativeCodeSize >= nativeCodeSize);
    ::InterlockedExchangeSubtract(&processNativeCodeSize, nativeCodeSize);

    PERF_COUNTER_DEC(Basic, ThreadContext);

#ifdef DYNAMIC_PROFILE_MUTATOR
    if (this->dynamicProfileMutator != nullptr)
    {
        this->dynamicProfileMutator->Delete();
    }
#endif
}